

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O0

UBool icu_63::CollationBuilder::sameCEs
                (int64_t *ces1,int32_t ces1Length,int64_t *ces2,int32_t ces2Length)

{
  int local_30;
  int32_t i;
  int32_t ces2Length_local;
  int64_t *ces2_local;
  int32_t ces1Length_local;
  int64_t *ces1_local;
  
  if (ces1Length == ces2Length) {
    for (local_30 = 0; local_30 < ces1Length; local_30 = local_30 + 1) {
      if (ces1[local_30] != ces2[local_30]) {
        return '\0';
      }
    }
    ces1_local._7_1_ = '\x01';
  }
  else {
    ces1_local._7_1_ = '\0';
  }
  return ces1_local._7_1_;
}

Assistant:

UBool
CollationBuilder::sameCEs(const int64_t ces1[], int32_t ces1Length,
                          const int64_t ces2[], int32_t ces2Length) {
    if(ces1Length != ces2Length) {
        return FALSE;
    }
    U_ASSERT(ces1Length <= Collation::MAX_EXPANSION_LENGTH);
    for(int32_t i = 0; i < ces1Length; ++i) {
        if(ces1[i] != ces2[i]) { return FALSE; }
    }
    return TRUE;
}